

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  byte **ppbVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar5;
  Fault *pFVar6;
  long lVar7;
  ssize_t sVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  word *pwVar12;
  word *pwVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong elementCount;
  ReaderOptions options_00;
  Fault f_1;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t> firstWord [2];
  WireValue<uint32_t> moreSizes_stack [16];
  ulong local_e0;
  Fault local_d8;
  ulong local_d0;
  ArrayDisposer *local_c8;
  uint64_t local_c0;
  Fault *local_b8;
  ulong uStack_b0;
  undefined8 *local_a8;
  InputStream *local_a0;
  Array<kj::ArrayPtr<const_capnp::word>_> *local_98;
  Array<capnp::word> *local_90;
  int local_88;
  uint local_84;
  size_t local_80;
  Fault local_78 [9];
  
  pwVar13 = scratchSpace.ptr;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_001c9b50;
  this->inputStream = inputStream;
  local_98 = &this->moreSegments;
  local_90 = &this->ownedSpace;
  this->readPos = (byte *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->ownedSpace).ptr = (word *)0x0;
  (this->ownedSpace).size_ = 0;
  (this->ownedSpace).disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  local_c0 = options.traversalLimitInWords;
  kj::InputStream::read(inputStream,(int)&local_88,(void *)0x8,8);
  uVar11 = 0;
  uVar15 = local_88 + 1;
  if (uVar15 != 0) {
    uVar11 = (ulong)local_84;
  }
  local_e0 = uVar11;
  if (0x1ff < uVar15) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              (local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xba,FAILED,"segmentCount < 512","\"Message has too many segments.\"",
               (char (*) [31])"Message has too many segments.");
    kj::_::Debug::Fault::~Fault(local_78);
    local_e0 = 1;
    uVar15 = 1;
  }
  uVar16 = uVar15 & 0x1fe;
  uVar9 = (ulong)uVar16;
  local_a0 = inputStream;
  if (uVar16 < 0x11) {
    local_b8 = (Fault *)0x0;
    uStack_b0 = 0;
    local_a8 = (undefined8 *)0x0;
    pFVar6 = local_78;
  }
  else {
    pFVar6 = (Fault *)kj::_::HeapArrayDisposer::allocateImpl
                                (4,uVar9,uVar9,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                                );
    local_a8 = &kj::_::HeapArrayDisposer::instance;
    uStack_b0 = uVar9;
    local_b8 = pFVar6;
  }
  local_80 = scratchSpace.size_;
  if (1 < uVar15) {
    if (0x10 < uVar16) {
      uVar9 = uStack_b0;
    }
    kj::InputStream::read(local_a0,(int)pFVar6,(void *)(uVar9 << 2),(size_t)(uVar9 << 2));
    if (uVar15 - 1 != 0) {
      uVar9 = 0;
      do {
        uVar11 = uVar11 + *(uint *)((long)&pFVar6->exception + uVar9 * 4);
        uVar9 = uVar9 + 1;
      } while (uVar15 - 1 != uVar9);
    }
  }
  if (local_c0 < uVar11) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[93]>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xce,FAILED,"totalWords <= options.traversalLimitInWords",
               "\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(char (*) [93])
                "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    kj::_::Debug::Fault::~Fault(&local_d8);
    if (local_c0 < local_e0) {
      local_e0 = local_c0;
    }
    uVar15 = 1;
    uVar11 = local_e0;
  }
  if (local_80 < uVar11) {
    local_d8.exception =
         (Exception *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,uVar11,uVar11,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_c8 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pwVar13 = local_90->ptr;
    local_d0 = uVar11;
    if (pwVar13 != (word *)0x0) {
      sVar2 = (this->ownedSpace).size_;
      local_90->ptr = (word *)0x0;
      local_90->size_ = 0;
      pAVar3 = (this->ownedSpace).disposer;
      (*(code *)**(undefined8 **)pAVar3)(pAVar3,pwVar13,8,sVar2,sVar2,0);
    }
    (this->ownedSpace).ptr = (word *)local_d8.exception;
    (this->ownedSpace).size_ = local_d0;
    (this->ownedSpace).disposer = local_c8;
    pwVar13 = (this->ownedSpace).ptr;
  }
  uVar9 = local_e0 & 0xffffffff;
  (this->segment0).ptr = pwVar13;
  (this->segment0).size_ = uVar9;
  if (1 < uVar15) {
    elementCount = (ulong)(uVar15 - 1);
    local_c0 = uVar9;
    local_d8.exception =
         (Exception *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x10,elementCount,elementCount,
                    kj::_::HeapArrayDisposer::
                    Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::construct,
                    kj::_::HeapArrayDisposer::
                    Allocate_<kj::ArrayPtr<const_capnp::word>,_false,_false>::destruct);
    pAVar5 = local_98;
    local_c8 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    pAVar4 = local_98->ptr;
    local_d0 = elementCount;
    if (pAVar4 != (ArrayPtr<const_capnp::word> *)0x0) {
      sVar2 = (this->moreSegments).size_;
      local_98->ptr = (ArrayPtr<const_capnp::word> *)0x0;
      local_98->size_ = 0;
      pAVar3 = (this->moreSegments).disposer;
      (*(code *)**(undefined8 **)pAVar3)(pAVar3,pAVar4,0x10,sVar2,sVar2,0);
    }
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)local_d8.exception;
    (this->moreSegments).size_ = local_d0;
    (this->moreSegments).disposer = local_c8;
    uVar9 = local_c0;
    if (elementCount != 0) {
      lVar7 = 0;
      uVar10 = local_c0;
      do {
        uVar14 = (ulong)*(uint *)((long)&pFVar6->exception + lVar7);
        pwVar12 = pwVar13 + uVar10;
        uVar10 = uVar10 + uVar14;
        pAVar4 = pAVar5->ptr;
        *(word **)((long)&pAVar4->ptr + lVar7 * 4) = pwVar12;
        *(ulong *)((long)&pAVar4->size_ + lVar7 * 4) = uVar14;
        lVar7 = lVar7 + 4;
      } while (elementCount << 2 != lVar7);
    }
  }
  if (uVar15 == 1) {
    kj::InputStream::read(local_a0,(int)pwVar13,(void *)(uVar11 << 3),(size_t)(uVar11 << 3));
  }
  else if (1 < uVar15) {
    ppbVar1 = &this->readPos;
    *ppbVar1 = (byte *)pwVar13;
    sVar8 = kj::InputStream::read(local_a0,(int)pwVar13,(void *)(uVar9 << 3),uVar11 << 3);
    *ppbVar1 = *ppbVar1 + sVar8;
  }
  uVar11 = uStack_b0;
  pFVar6 = local_b8;
  if (local_b8 != (Fault *)0x0) {
    local_b8 = (Fault *)0x0;
    uStack_b0 = 0;
    (**(code **)*local_a8)(local_a8,pFVar6,4,uVar11,uVar11,0);
  }
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(firstWord, sizeof(firstWord));

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.begin(), moreSizes.size() * sizeof(moreSizes[0]));
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.slice(0, segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.begin(), totalWords * sizeof(word));
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(readPos, segment0Size * sizeof(word), totalWords * sizeof(word));
  }
}